

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

double get_ieee754_double(uint8_t *p)

{
  double d;
  
  return (double)CONCAT17(*p,CONCAT16(p[1],CONCAT15(p[2],CONCAT14(p[3],CONCAT13(p[4],CONCAT12(p[5],
                                                  CONCAT11(p[6],p[7])))))));
}

Assistant:

static double get_ieee754_double(const uint8_t *restrict p) {
    volatile double d;
    volatile uint8_t *q = (volatile void *)&d;
#if MMDB_LITTLE_ENDIAN || _WIN32
    q[7] = p[0];
    q[6] = p[1];
    q[5] = p[2];
    q[4] = p[3];
    q[3] = p[4];
    q[2] = p[5];
    q[1] = p[6];
    q[0] = p[7];
#else
    memcpy(q, p, 8);
#endif

    return d;
}